

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ParseBlock(Parser *this)

{
  bool bVar1;
  byte local_19;
  Parser *this_local;
  
  if ((this->m_error & 1U) == 0) {
    ScopeBegin(this);
    while( true ) {
      bVar1 = Check(this,End);
      local_19 = 0;
      if (!bVar1) {
        bVar1 = Check(this,Else);
        local_19 = 0;
        if (!bVar1) {
          bVar1 = Check(this,Until);
          local_19 = 0;
          if (!bVar1) {
            bVar1 = Check(this,While);
            local_19 = 0;
            if (!bVar1) {
              local_19 = this->m_error ^ 0xff;
            }
          }
        }
      }
      if ((local_19 & 1) == 0) break;
      ParseStatement(this);
    }
    ScopeEnd(this);
  }
  return;
}

Assistant:

inline_t void Parser::ParseBlock()
	{
		if (m_error)
			return;

		// Push local variable stack frame
		ScopeBegin();

		// Parse each statement until we reach a terminating symbol
		while (!(Check(SymbolType::End) || Check(SymbolType::Else) || Check(SymbolType::Until) || Check(SymbolType::While)) && !m_error)
			ParseStatement();

		// Pop local variable stack frame
		ScopeEnd();
	}